

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_filter.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::StructFilter::Copy(StructFilter *this)

{
  _func_int **pp_Var1;
  pointer pTVar2;
  long in_RSI;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_30;
  _func_int **local_28;
  
  pTVar2 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
           operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                       *)(in_RSI + 0x38));
  (*pTVar2->_vptr_TableFilter[4])(&local_30,pTVar2);
  make_uniq<duckdb::StructFilter,unsigned_long_const&,std::__cxx11::string_const&,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>
            ((duckdb *)&local_28,(unsigned_long *)(in_RSI + 0x10),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x18),
             (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *)
             &local_30);
  pp_Var1 = local_28;
  local_28 = (_func_int **)0x0;
  (this->super_TableFilter)._vptr_TableFilter = pp_Var1;
  if (local_30._M_head_impl != (TableFilter *)0x0) {
    (*(local_30._M_head_impl)->_vptr_TableFilter[1])();
  }
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> StructFilter::Copy() const {
	return make_uniq<StructFilter>(child_idx, child_name, child_filter->Copy());
}